

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void codebinexpval(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2,int line)

{
  int v2;
  
  v2 = luaK_exp2anyreg(fs,e2);
  finishbinexpval(fs,e1,e2,opr + 0x22,v2,0,line,OP_MMBIN,opr + OPR_IDIV);
  return;
}

Assistant:

static void codebinexpval (FuncState *fs, BinOpr opr,
                           expdesc *e1, expdesc *e2, int line) {
  OpCode op = binopr2op(opr, OPR_ADD, OP_ADD);
  int v2 = luaK_exp2anyreg(fs, e2);  /* make sure 'e2' is in a register */
  /* 'e1' must be already in a register or it is a constant */
  lua_assert((VNIL <= e1->k && e1->k <= VKSTR) ||
             e1->k == VNONRELOC || e1->k == VRELOC);
  lua_assert(OP_ADD <= op && op <= OP_SHR);
  finishbinexpval(fs, e1, e2, op, v2, 0, line, OP_MMBIN, binopr2TM(opr));
}